

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cpp
# Opt level: O1

void __thiscall pfederc::StringToken::~StringToken(StringToken *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__StringToken_00128660;
  pcVar1 = (this->str)._M_dataplus._M_p;
  paVar2 = &(this->str).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

StringToken::~StringToken() {
}